

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Widget_Type.cxx
# Opt level: O0

void subclass_cb(Fl_Input *i,void *v)

{
  bool bVar1;
  int iVar2;
  char *pcVar3;
  Fl_Widget_Type *t;
  Fl_Type *o;
  char *c;
  int mod;
  void *v_local;
  Fl_Input *i_local;
  
  if ((char *)v == "LOAD") {
    iVar2 = (*(current_widget->super_Fl_Type)._vptr_Fl_Type[0x1e])();
    if (iVar2 == 0) {
      Fl_Widget::activate((Fl_Widget *)i);
      pcVar3 = Fl_Widget_Type::subclass(current_widget);
      Fl_Input_::static_value(&i->super_Fl_Input_,pcVar3);
    }
    else {
      Fl_Widget::deactivate((Fl_Widget *)i);
    }
  }
  else {
    bVar1 = false;
    pcVar3 = Fl_Input_::value(&i->super_Fl_Input_);
    for (t = (Fl_Widget_Type *)Fl_Type::first; t != (Fl_Widget_Type *)0x0;
        t = (Fl_Widget_Type *)(t->super_Fl_Type).next) {
      if (((t->super_Fl_Type).selected != '\0') &&
         (iVar2 = (*(t->super_Fl_Type)._vptr_Fl_Type[0x17])(), iVar2 != 0)) {
        Fl_Widget_Type::subclass(t,pcVar3);
        bVar1 = true;
      }
    }
    if (bVar1) {
      set_modflag(1);
    }
  }
  return;
}

Assistant:

void subclass_cb(Fl_Input* i, void* v) {
  if (v == LOAD) {
    if (current_widget->is_menu_item()) {i->deactivate(); return;} else i->activate();
    i->static_value(current_widget->subclass());
  } else {
    int mod = 0;
    const char *c = i->value();
    for (Fl_Type *o = Fl_Type::first; o; o = o->next) {
      if (o->selected && o->is_widget()) {
	Fl_Widget_Type *t = (Fl_Widget_Type*)o;
	t->subclass(c);
	mod = 1;
      }
    }
    if (mod) set_modflag(1);
  }
}